

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void invalidateIncrblobCursors(Btree *pBtree,Pgno pgnoRoot,i64 iRow,int isClearTable)

{
  BtCursor *local_30;
  BtCursor *p;
  int isClearTable_local;
  i64 iRow_local;
  Pgno pgnoRoot_local;
  Btree *pBtree_local;
  
  pBtree->hasIncrblobCur = '\0';
  for (local_30 = pBtree->pBt->pCursor; local_30 != (BtCursor *)0x0; local_30 = local_30->pNext) {
    if ((((local_30->curFlags & 0x10) != 0) &&
        (pBtree->hasIncrblobCur = '\x01', local_30->pgnoRoot == pgnoRoot)) &&
       ((isClearTable != 0 || ((local_30->info).nKey == iRow)))) {
      local_30->eState = '\x01';
    }
  }
  return;
}

Assistant:

static void invalidateIncrblobCursors(
  Btree *pBtree,          /* The database file to check */
  Pgno pgnoRoot,          /* The table that might be changing */
  i64 iRow,               /* The rowid that might be changing */
  int isClearTable        /* True if all rows are being deleted */
){
  BtCursor *p;
  assert( pBtree->hasIncrblobCur );
  assert( sqlite3BtreeHoldsMutex(pBtree) );
  pBtree->hasIncrblobCur = 0;
  for(p=pBtree->pBt->pCursor; p; p=p->pNext){
    if( (p->curFlags & BTCF_Incrblob)!=0 ){
      pBtree->hasIncrblobCur = 1;
      if( p->pgnoRoot==pgnoRoot && (isClearTable || p->info.nKey==iRow) ){
        p->eState = CURSOR_INVALID;
      }
    }
  }
}